

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator
fmt::v10::detail::write_escaped_string<char,fmt::v10::detail::counting_iterator>
          (counting_iterator out,basic_string_view<char> str)

{
  char *pcVar1;
  anon_class_8_1_6971b95b_for_f in_RCX;
  find_escape_result<char> *pfVar2;
  find_escape_result<char> *this;
  counting_iterator it;
  counting_iterator out_00;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_40;
  
  out_00.count_ = out.count_ + 1;
  pfVar2 = (find_escape_result<char> *)
           ((long)&((find_escape_result<char> *)str.data_)->begin + str.size_);
  this = (find_escape_result<char> *)str.data_;
  do {
    local_40.end = (char *)0x0;
    local_40.cp = 0;
    s.data_ = (char *)((long)pfVar2 - (long)this);
    local_40.begin = (char *)pfVar2;
    if ((long)s.data_ < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    s.size_ = (size_t)&local_40;
    for_each_codepoint<fmt::v10::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
              ((detail *)this,s,in_RCX);
    pcVar1 = local_40.end;
    if (this != (find_escape_result<char> *)local_40.begin) {
      out_00.count_ = (out_00.count_ - (long)this) + (long)local_40.begin;
    }
  } while (((find_escape_result<char> *)local_40.end != (find_escape_result<char> *)0x0) &&
          (out_00 = write_escaped_cp<fmt::v10::detail::counting_iterator,char>(out_00,&local_40),
          in_RCX.result = (find_escape_result<char> *)local_40.begin,
          this = (find_escape_result<char> *)pcVar1, (find_escape_result<char> *)pcVar1 != pfVar2));
  return (counting_iterator)(out_00.count_ + 1);
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}